

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVisualShapeFEA.cpp
# Opt level: O1

void __thiscall
chrono::ChVisualShapeFEA::ChVisualShapeFEA
          (ChVisualShapeFEA *this,shared_ptr<chrono::fea::ChMesh> *fea_mesh)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  ChTriangleMeshShape *this_00;
  ChGlyphs *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  ChTriangleMeshShape *size;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  (this->FEMmesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->FEMmesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->meshcolor).R = 1.0;
  (this->meshcolor).G = 1.0;
  (this->meshcolor).B = 1.0;
  (this->symbolscolor).R = 1.0;
  (this->symbolscolor).G = 1.0;
  (this->symbolscolor).B = 1.0;
  (this->m_trimesh_shape).
  super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_trimesh_shape).
  super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_glyphs_shape).super___shared_ptr<chrono::ChGlyphs,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_glyphs_shape).super___shared_ptr<chrono::ChGlyphs,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_glyphs_shape).super___shared_ptr<chrono::ChGlyphs,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->normal_accumulators).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->normal_accumulators).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->normal_accumulators).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->FEMmesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (fea_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  __r = &(fea_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->FEMmesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__r);
  this->fem_data_type = SURFACE;
  this->fem_glyph = NONE;
  this->colorscale_min = 0.0;
  this->colorscale_max = 1.0;
  this->symbols_scale = 1.0;
  this->symbols_thickness = 0.002;
  this->shrink_elements = false;
  this->shrink_factor = 0.9;
  this->wireframe = false;
  this->backface_cull = false;
  this->zbuffer_hide = true;
  this->smooth_faces = false;
  this->beam_resolution = 8;
  this->beam_resolution_section = 10;
  this->shell_resolution = 3;
  (this->meshcolor).R = 1.0;
  (this->meshcolor).G = 1.0;
  *(undefined8 *)&(this->meshcolor).B = 0x3f800000;
  (this->symbolscolor).G = 0.5;
  (this->symbolscolor).B = 0.5;
  this->undeformed_reference = false;
  this_00 = (ChTriangleMeshShape *)ChVisualShape::operator_new((ChVisualShape *)0x98,(size_t)__r);
  ChTriangleMeshShape::ChTriangleMeshShape(this_00);
  size = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChTriangleMeshShape*>
            (a_Stack_30,this_00);
  _Var2._M_pi = a_Stack_30[0]._M_pi;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->m_trimesh_shape).
           super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->m_trimesh_shape).
  super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  (this->m_trimesh_shape).
  super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
  }
  this_01 = (ChGlyphs *)ChVisualShape::operator_new((ChVisualShape *)0xa0,(size_t)size);
  ChGlyphs::ChGlyphs(this_01);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChGlyphs*>
            (a_Stack_30,this_01);
  _Var2._M_pi = a_Stack_30[0]._M_pi;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->m_glyphs_shape).super___shared_ptr<chrono::ChGlyphs,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_glyphs_shape).super___shared_ptr<chrono::ChGlyphs,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this_01;
  (this->m_glyphs_shape).super___shared_ptr<chrono::ChGlyphs,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
  }
  return;
}

Assistant:

ChVisualShapeFEA::ChVisualShapeFEA(std::shared_ptr<fea::ChMesh> fea_mesh) {
    FEMmesh = fea_mesh;
    fem_data_type = DataType::SURFACE;
    fem_glyph = GlyphType::NONE;

    colorscale_min = 0;
    colorscale_max = 1;

    shrink_elements = false;
    shrink_factor = 0.9;

    symbols_scale = 1.0;
    symbols_thickness = 0.002;

    wireframe = false;
    backface_cull = false;

    zbuffer_hide = true;

    smooth_faces = false;

    beam_resolution = 8;
    beam_resolution_section = 10;
    shell_resolution = 3;

    meshcolor = ChColor(1, 1, 1);
    symbolscolor = ChColor(0, 0.5, 0.5);

    undeformed_reference = false;

    m_trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
    m_glyphs_shape = chrono_types::make_shared<ChGlyphs>();
}